

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_trytogetmoreguibuf(int newsize)

{
  int iVar1;
  ssize_t sVar2;
  char *local_30;
  int local_20;
  int res;
  int written;
  int bytestowrite;
  char *newbuf;
  int newsize_local;
  
  if (newsize < 0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = (char *)realloc((pd_maininstance.pd_inter)->i_guibuf,(long)newsize);
  }
  if (local_30 == (char *)0x0) {
    iVar1 = (pd_maininstance.pd_inter)->i_guihead - (pd_maininstance.pd_inter)->i_guitail;
    local_20 = 0;
    do {
      while( true ) {
        sVar2 = send((pd_maininstance.pd_inter)->i_guisock,
                     (pd_maininstance.pd_inter)->i_guibuf +
                     (long)local_20 + (long)(pd_maininstance.pd_inter)->i_guitail,(long)iVar1,0);
        if (-1 < (int)sVar2) break;
        perror("pd output pipe");
        sys_bail(1);
      }
      local_20 = (int)sVar2 + local_20;
    } while (local_20 < iVar1);
    (pd_maininstance.pd_inter)->i_guitail = 0;
    (pd_maininstance.pd_inter)->i_guihead = 0;
  }
  else {
    (pd_maininstance.pd_inter)->i_guisize = newsize;
    (pd_maininstance.pd_inter)->i_guibuf = local_30;
  }
  return;
}

Assistant:

static void sys_trytogetmoreguibuf(int newsize)
{
        /* newsize can be negative if it overflows (at 0x7FFFFFFF)
         * which only happens if we push a huge amount of data to the GUI,
         * such as printing a billion numbers
         *
         * we could fix this by using size_t (or ssize_t), but this will
         * possibly lead to memory exhaustion.
         * as the overflow happens at 2GB which is rather large anyhow,
         * but most machines will still be able to handle this without swapping
         * and crashing, we just use the 2GB limit to trigger a synchronous write.
	 * also note that on the Tcl/Tk side, the maximum size of a buffer is 2GB,
	 * so there's a nice analogy here.
         */
    char *newbuf = (newsize>=0)?realloc(INTER->i_guibuf, newsize):0;
#if 0
    static int sizewas;
    if (newsize > 70000 && sizewas < 70000)
    {
        int i;
        for (i = INTER->i_guitail; i < INTER->i_guihead; i++)
                fputc(INTER->i_guibuf[i], stderr);
    }
    sizewas = newsize;
#endif
#if 0
    fprintf(stderr, "new size %d (head %d, tail %d)\n",
        newsize, INTER->i_guihead, INTER->i_guitail);
#endif

        /* if realloc fails, make a last-ditch attempt to stay alive by
        synchronously writing out the existing contents.  LATER test
        this by intentionally setting newbuf to zero */
    if (!newbuf)
    {
        int bytestowrite = INTER->i_guihead - INTER->i_guitail;
        int written = 0;
        while (1)
        {
            int res = (int)send(
                INTER->i_guisock,
                INTER->i_guibuf + INTER->i_guitail + written,
                bytestowrite, 0);
            if (res < 0)
            {
                perror("pd output pipe");
                sys_bail(1);
            }
            else
            {
                written += res;
                if (written >= bytestowrite)
                    break;
            }
        }
        INTER->i_guihead = INTER->i_guitail = 0;
    }
    else
    {
        INTER->i_guisize = newsize;
        INTER->i_guibuf = newbuf;
    }
}